

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

bool __thiscall SubprocessSet::DoWork(SubprocessSet *this)

{
  bool bVar1;
  int *piVar2;
  reference ppSVar3;
  const_iterator local_e8;
  Subprocess **local_e0;
  int local_d4;
  iterator iStack_d0;
  int fd_1;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_c8;
  iterator i_1;
  int ret;
  int fd;
  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
  local_b0;
  iterator i;
  fd_set *__arr;
  uint __i;
  int nfds;
  fd_set set;
  SubprocessSet *this_local;
  
  __arr._4_4_ = 0;
  i._M_current = (Subprocess **)&__i;
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    i._M_current[(uint)__arr] = (Subprocess *)0x0;
  }
  set.fds_bits[0xf] = (__fd_mask)this;
  local_b0._M_current =
       (Subprocess **)
       std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
  while( true ) {
    _ret = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_);
    bVar1 = __gnu_cxx::operator!=
                      (&local_b0,
                       (__normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                        *)&ret);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
              ::operator*(&local_b0);
    i_1._M_current._4_4_ = (*ppSVar3)->fd_;
    if ((-1 < i_1._M_current._4_4_) &&
       (*(ulong *)(&__i + (long)(i_1._M_current._4_4_ / 0x40) * 2) =
             1L << ((byte)((long)i_1._M_current._4_4_ % 0x40) & 0x3f) |
             *(ulong *)(&__i + (long)(i_1._M_current._4_4_ / 0x40) * 2),
       __arr._4_4_ < i_1._M_current._4_4_ + 1)) {
      __arr._4_4_ = i_1._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>::
    operator++(&local_b0);
  }
  interrupted_ = 0;
  i_1._M_current._0_4_ =
       pselect(__arr._4_4_,(fd_set *)&__i,(fd_set *)0x0,(fd_set *)0x0,(timespec *)0x0,
               (__sigset_t *)&this->old_mask_);
  if ((int)i_1._M_current == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      this_local._7_1_ = IsInterrupted();
    }
    else {
      perror("ninja: pselect");
      this_local._7_1_ = false;
    }
  }
  else {
    HandlePendingInterruption();
    bVar1 = IsInterrupted();
    if (!bVar1) {
      local_c8._M_current =
           (Subprocess **)
           std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::begin(&this->running_);
      do {
        while( true ) {
          iStack_d0 = std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::end(&this->running_)
          ;
          bVar1 = __gnu_cxx::operator!=(&local_c8,&stack0xffffffffffffff30);
          if (!bVar1) {
            bVar1 = IsInterrupted();
            return bVar1;
          }
          ppSVar3 = __gnu_cxx::
                    __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                    ::operator*(&local_c8);
          local_d4 = (*ppSVar3)->fd_;
          if ((-1 < local_d4) &&
             ((*(ulong *)(&__i + (long)(local_d4 / 0x40) * 2) &
              1L << ((byte)((long)local_d4 % 0x40) & 0x3f)) != 0)) break;
LAB_001458c4:
          __gnu_cxx::
          __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
          ::operator++(&local_c8);
        }
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_c8);
        Subprocess::OnPipeReady(*ppSVar3);
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_c8);
        bVar1 = Subprocess::Done(*ppSVar3);
        if (!bVar1) goto LAB_001458c4;
        ppSVar3 = __gnu_cxx::
                  __normal_iterator<Subprocess_**,_std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>_>
                  ::operator*(&local_c8);
        std::queue<Subprocess_*,_std::deque<Subprocess_*,_std::allocator<Subprocess_*>_>_>::push
                  (&this->finished_,ppSVar3);
        __gnu_cxx::
        __normal_iterator<Subprocess*const*,std::vector<Subprocess*,std::allocator<Subprocess*>>>::
        __normal_iterator<Subprocess**>
                  ((__normal_iterator<Subprocess*const*,std::vector<Subprocess*,std::allocator<Subprocess*>>>
                    *)&local_e8,&local_c8);
        local_e0 = (Subprocess **)
                   std::vector<Subprocess_*,_std::allocator<Subprocess_*>_>::erase
                             (&this->running_,local_e8);
        local_c8._M_current = local_e0;
      } while( true );
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SubprocessSet::DoWork() {
  fd_set set;
  int nfds = 0;
  FD_ZERO(&set);

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ++i) {
    int fd = (*i)->fd_;
    if (fd >= 0) {
      FD_SET(fd, &set);
      if (nfds < fd+1)
        nfds = fd+1;
    }
  }

  interrupted_ = 0;
  int ret = pselect(nfds, &set, 0, 0, 0, &old_mask_);
  if (ret == -1) {
    if (errno != EINTR) {
      perror("ninja: pselect");
      return false;
    }
    return IsInterrupted();
  }

  HandlePendingInterruption();
  if (IsInterrupted())
    return true;

  for (vector<Subprocess*>::iterator i = running_.begin();
       i != running_.end(); ) {
    int fd = (*i)->fd_;
    if (fd >= 0 && FD_ISSET(fd, &set)) {
      (*i)->OnPipeReady();
      if ((*i)->Done()) {
        finished_.push(*i);
        i = running_.erase(i);
        continue;
      }
    }
    ++i;
  }

  return IsInterrupted();
}